

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> *
FromBytes(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
         span<const_std::byte,_18446744073709551615UL> source)

{
  byte bVar1;
  _Bit_type *p_Var2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int bit_i;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  _Bit_type _Var10;
  long in_FS_OFFSET;
  allocator_type local_22;
  bool local_21;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (int)source._M_extent._M_extent_value << 3;
  local_21 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(long)iVar3,&local_21,&local_22);
  uVar8 = iVar3 >> 3;
  if (0 < (int)uVar8) {
    p_Var2 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar4 = 0;
    uVar5 = 0;
    do {
      bVar1 = source._M_ptr[uVar5];
      lVar6 = 0;
      do {
        uVar7 = (ulong)(lVar4 + lVar6) >> 6;
        uVar9 = 1L << (((byte)lVar4 & 0x3f) + (char)lVar6 & 0x3f);
        if ((bVar1 >> ((uint)lVar6 & 0x1f) & 1) == 0) {
          _Var10 = ~uVar9 & p_Var2[uVar7];
        }
        else {
          _Var10 = uVar9 | p_Var2[uVar7];
        }
        p_Var2[uVar7] = _Var10;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 8;
    } while (uVar5 != uVar8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<bool> FromBytes(std::span<const std::byte> source)
{
    int vector_size(source.size() * 8);
    std::vector<bool> result(vector_size);
    for (int byte_i = 0; byte_i < vector_size / 8; ++byte_i) {
        uint8_t cur_byte{std::to_integer<uint8_t>(source[byte_i])};
        for (int bit_i = 0; bit_i < 8; ++bit_i) {
            result[byte_i * 8 + bit_i] = (cur_byte >> bit_i) & 1;
        }
    }
    return result;
}